

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityDamageStatusPdu.cpp
# Opt level: O0

int __thiscall DIS::EntityDamageStatusPdu::getMarshalledSize(EntityDamageStatusPdu *this)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  undefined1 local_80 [8];
  DirectedEnergyDamage listElement;
  unsigned_long_long idx;
  int marshalSize;
  EntityDamageStatusPdu *this_local;
  
  iVar2 = WarfareFamilyPdu::getMarshalledSize(&this->super_WarfareFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_damagedEntityID);
  idx._4_4_ = iVar2 + iVar3 + 6;
  listElement._padding2 = 0;
  listElement._90_6_ = 0;
  while( true ) {
    uVar1 = listElement._88_8_;
    sVar4 = std::vector<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>::size
                      (&this->_damageDescriptionRecords);
    if (sVar4 <= (ulong)uVar1) break;
    pvVar5 = std::vector<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>::
             operator[](&this->_damageDescriptionRecords,listElement._88_8_);
    DirectedEnergyDamage::DirectedEnergyDamage((DirectedEnergyDamage *)local_80,pvVar5);
    iVar2 = DirectedEnergyDamage::getMarshalledSize((DirectedEnergyDamage *)local_80);
    idx._4_4_ = idx._4_4_ + iVar2;
    DirectedEnergyDamage::~DirectedEnergyDamage((DirectedEnergyDamage *)local_80);
    listElement._88_8_ = listElement._88_8_ + 1;
  }
  return idx._4_4_;
}

Assistant:

int EntityDamageStatusPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = WarfareFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _damagedEntityID.getMarshalledSize();  // _damagedEntityID
   marshalSize = marshalSize + 2;  // _padding1
   marshalSize = marshalSize + 2;  // _padding2
   marshalSize = marshalSize + 2;  // _numberOfDamageDescription

   for(unsigned long long idx=0; idx < _damageDescriptionRecords.size(); idx++)
   {
        DirectedEnergyDamage listElement = _damageDescriptionRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}